

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,message *msg,bool sel)

{
  undefined7 in_register_00000009;
  
  *(uint *)this = (*(uint *)this & 0xfffffff8) + (int)CONCAT71(in_register_00000009,sel) * 5 + 2;
  std::__cxx11::string::string((string *)&this->id,(string *)val);
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  (this->str_option)._M_string_length = 0;
  (this->str_option).field_2._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::basic_message(&this->tr_option,msg);
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,locale::message const &msg,bool sel) :
	selected(sel),
	need_translation(1),
	original_select(sel),
	id(val),
	tr_option(msg)
{
}